

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall XInputSimulatorImplLinux::XInputSimulatorImplLinux(XInputSimulatorImplLinux *this)

{
  int iVar1;
  Display *pDVar2;
  ostream *this_00;
  char local_484 [8];
  uinput_user_dev uidev;
  Screen *pscr;
  XInputSimulatorImplLinux *this_local;
  
  XInputSimulatorImpl::XInputSimulatorImpl(&this->super_XInputSimulatorImpl);
  (this->super_XInputSimulatorImpl)._vptr_XInputSimulatorImpl =
       (_func_int **)&PTR__XInputSimulatorImplLinux_00110ce0;
  pDVar2 = (Display *)XOpenDisplay(0);
  this->display = pDVar2;
  if (pDVar2 == (Display *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"can not access display server!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    this->root = *(Window *)
                  (*(long *)(this->display + 0xe8) + 0x10 +
                  (long)*(int *)(this->display + 0xe0) * 0x80);
    uidev.absflat._248_8_ =
         *(long *)(this->display + 0xe8) + (long)*(int *)(this->display + 0xe0) * 0x80;
    this->displayX = (long)*(int *)(uidev.absflat._248_8_ + 0x18);
    this->displayY = (long)*(int *)(uidev.absflat._248_8_ + 0x1c);
    iVar1 = open("/dev/uinput",0x801);
    this->fd = iVar1;
    ioctl(this->fd,0x40045564);
    ioctl(this->fd,0x40045565,0x111);
    ioctl(this->fd,0x40045565,0x110);
    ioctl(this->fd,0x40045564,3);
    ioctl(this->fd,0x40045567,0);
    ioctl(this->fd,0x40045567,1);
    ioctl(this->fd,0x40045564,2);
    memset(local_484,0,0x45c);
    snprintf(local_484,0x50,"VirtualMouse");
    uidev.name[0x48] = '\x03';
    uidev.name[0x49] = '\0';
    uidev.name[0x4e] = '\x01';
    uidev.name[0x4f] = '\0';
    uidev.name[0x4a] = '\x01';
    uidev.name[0x4b] = '\0';
    uidev.name[0x4c] = '\x01';
    uidev.name[0x4d] = '\0';
    uidev.absmax[0x3e] = 0;
    uidev.id._4_4_ = *(undefined4 *)&this->displayX;
    uidev.absmax[0x3f] = 0;
    uidev.ff_effects_max = (__u32)this->displayY;
    write(this->fd,local_484,0x45c);
    ioctl(this->fd,0x5501);
    sleep(1);
  }
  return;
}

Assistant:

XInputSimulatorImplLinux::XInputSimulatorImplLinux()
{
    if((display = XOpenDisplay(NULL)) == NULL) {
        std::cout << "can not access display server!" << std::endl;
            return;
    }

    root = DefaultRootWindow(display);

    Screen* pscr = DefaultScreenOfDisplay( display );

    this->displayX = pscr->width;
    this->displayY = pscr->height;

   fd = open("/dev/uinput", O_WRONLY | O_NONBLOCK);
   ioctl(fd, UI_SET_EVBIT, EV_KEY);
   ioctl(fd, UI_SET_KEYBIT, BTN_RIGHT);
   ioctl(fd, UI_SET_KEYBIT, BTN_LEFT);
   ioctl(fd, UI_SET_EVBIT, EV_ABS);
   ioctl(fd, UI_SET_ABSBIT, ABS_X);
   ioctl(fd, UI_SET_ABSBIT, ABS_Y);
   ioctl(fd, UI_SET_EVBIT, EV_REL);

   struct uinput_user_dev uidev;
   memset(&uidev,0,sizeof(uidev));
   snprintf(uidev.name,UINPUT_MAX_NAME_SIZE,"VirtualMouse");
   uidev.id.bustype = BUS_USB;
   uidev.id.version = 1;
   uidev.id.vendor = 0x1;
   uidev.id.product = 0x1;
   uidev.absmin[ABS_X] = 0;
   uidev.absmax[ABS_X] = displayX;
   uidev.absmin[ABS_Y] = 0;
   uidev.absmax[ABS_Y] = displayY;

   write(fd, &uidev, sizeof(uidev));
   ioctl(fd, UI_DEV_CREATE);

   sleep(1);
}